

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReader::readMetaDataBlock
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  bool bVar1;
  long lVar2;
  uint32_t *puVar3;
  FilePos in_stack_ffffffffffffff58;
  PtexReader *in_stack_ffffffffffffff60;
  char *local_98;
  char *data;
  uint32_t datasize;
  uint8_t datatypeval;
  char *key;
  uint8_t keysize;
  char *end;
  char *ptr;
  char *buff;
  bool useNew;
  size_t *metaDataMemUsed_local;
  int memsize_local;
  int zipsize_local;
  FilePos pos_local;
  MetaData *metadata_local;
  PtexReader *this_local;
  
  puVar3 = (uint32_t *)&stack0xffffffffffffff58;
  seek(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (0x4000 < memsize) {
    local_98 = (char *)operator_new__((long)memsize);
  }
  else {
    puVar3 = (uint32_t *)(&stack0xffffffffffffff58 + -((long)memsize + 0xfU & 0xfffffffffffffff0));
    local_98 = (char *)puVar3;
  }
  puVar3[-2] = 0x9ef339;
  puVar3[-1] = 0;
  bVar1 = readZipBlock(this,local_98,zipsize,memsize);
  if (bVar1) {
    end = local_98;
    while (end < local_98 + memsize) {
      lVar2 = (long)(int)(uint)(byte)*end;
      end[(long)(int)((byte)*end - 1) + 1] = '\0';
      end = end + (ulong)*(uint *)(end + lVar2 + 2) + lVar2 + 6;
      *(size_t **)(puVar3 + -4) = metaDataMemUsed;
      puVar3[-6] = 0x9ef41d;
      puVar3[-5] = 0;
      MetaData::addEntry(*(MetaData **)(puVar3 + 6),*(uint8_t *)((long)puVar3 + 0x17),
                         *(char **)(puVar3 + 2),*(uint8_t *)((long)puVar3 + 7),*puVar3,
                         *(void **)(puVar3 + -2),*(size_t **)(puVar3 + 10));
    }
  }
  if ((0x4000 < memsize) && (local_98 != (char *)0x0)) {
    puVar3[-2] = 0x9ef44b;
    puVar3[-1] = 0;
    operator_delete__(local_98);
  }
  return;
}

Assistant:

void PtexReader::readMetaDataBlock(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char[memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            key[keysize-1] = '\0';
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            char* data = ptr; ptr += datasize;
            metadata->addEntry((uint8_t)(keysize-1), key, datatypeval, datasize, data, metaDataMemUsed);
        }
    }
    if (useNew) delete [] buff;
}